

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

string * __thiscall
cmGlobalNinjaGenerator::EncodePath
          (string *__return_storage_ptr__,cmGlobalNinjaGenerator *this,string *path)

{
  undefined1 local_40 [8];
  string result;
  string *path_local;
  cmGlobalNinjaGenerator *this_local;
  
  result.field_2._8_8_ = path;
  std::__cxx11::string::string((string *)local_40,(string *)path);
  EncodeLiteral(__return_storage_ptr__,(string *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaGenerator::EncodePath(const std::string& path)
{
  std::string result = path; // NOLINT(clang-tidy)
#ifdef _WIN32
  if (this->IsGCCOnWindows())
    std::replace(result.begin(), result.end(), '\\', '/');
  else
    std::replace(result.begin(), result.end(), '/', '\\');
#endif
  return EncodeLiteral(result);
}